

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

char16 * __thiscall
Js::FunctionProxy::GetShortDisplayName(FunctionProxy *this,charcount_t *shortNameLength)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 *puVar4;
  ScriptContext *this_00;
  Recycler *pRVar5;
  bool local_89;
  TrackAllocData local_70;
  FunctionProxy *local_48;
  char16 *finalshorterName;
  FunctionProxy *pFStack_38;
  bool isBracketCase;
  char16 *shortName;
  uint shortNameOffset;
  uint nameLength;
  char16 *name;
  charcount_t *shortNameLength_local;
  FunctionProxy *this_local;
  
  name = (char16 *)shortNameLength;
  shortNameLength_local = (charcount_t *)this;
  iVar3 = (*(this->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[7])();
  _shortNameOffset = (FunctionProxy *)CONCAT44(extraout_var,iVar3);
  shortName._4_4_ =
       (*(this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
         [8])();
  if (_shortNameOffset == (FunctionProxy *)0x0) {
    name[0] = L'\0';
    name[1] = L'\0';
    this_local = (FunctionProxy *)Constants::Empty;
  }
  else {
    bVar2 = IsConstantFunctionName((char16 *)_shortNameOffset);
    if (bVar2) {
      *(uint *)name = shortName._4_4_;
      this_local = _shortNameOffset;
    }
    else {
      shortName._0_4_ =
           (*(this->super_FinalizableObject).super_IRecyclerVisitedObject.
             _vptr_IRecyclerVisitedObject[9])();
      pFStack_38 = (FunctionProxy *)
                   ((long)&(_shortNameOffset->super_FinalizableObject).super_IRecyclerVisitedObject.
                           _vptr_IRecyclerVisitedObject + (ulong)(uint)shortName * 2);
      local_89 = false;
      if ((uint)shortName != 0) {
        local_89 = *(char16 *)
                    ((long)&(_shortNameOffset->super_FinalizableObject).super_IRecyclerVisitedObject
                            ._vptr_IRecyclerVisitedObject + (ulong)((uint)shortName - 1) * 2) ==
                   L'[';
      }
      finalshorterName._7_1_ = local_89;
      if (shortName._4_4_ < (uint)shortName) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xad5,"(nameLength >= shortNameOffset)",
                                    "nameLength >= shortNameOffset");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      *(uint *)name = shortName._4_4_ - (uint)shortName;
      if ((finalshorterName._7_1_ & 1) == 0) {
        this_local = pFStack_38;
      }
      else {
        if (*(char16 *)
             ((long)&(_shortNameOffset->super_FinalizableObject).super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject + (ulong)(shortName._4_4_ - 1) * 2) != L']') {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                      ,0xadd,"(name[nameLength - 1] == \']\')",
                                      "name[nameLength - 1] == \']\'");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        this_00 = GetScriptContext(this);
        pRVar5 = ScriptContext::GetRecycler(this_00);
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_70,(type_info *)&char16_t::typeinfo,0,(ulong)*(uint *)name,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                   ,0xade);
        pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_70);
        local_48 = (FunctionProxy *)
                   Memory::AllocateArray<Memory::Recycler,char16_t,false>
                             ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeaf,0,
                              (ulong)*(uint *)name);
        js_wmemcpy_s((char16 *)local_48,(ulong)*(uint *)name,(char16 *)pFStack_38,
                     (ulong)(*(int *)name - 1));
        *(char16_t *)
         ((long)&(local_48->super_FinalizableObject).super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject + (ulong)(*(int *)name - 1) * 2) = L'\0';
        *(int *)name = *(int *)name + -1;
        this_local = local_48;
      }
    }
  }
  return (char16 *)this_local;
}

Assistant:

const char16* FunctionProxy::GetShortDisplayName(charcount_t * shortNameLength)
    {
        const char16* name = this->GetDisplayName();
        uint nameLength = this->GetDisplayNameLength();

        if (name == nullptr)
        {
            *shortNameLength = 0;
            return Constants::Empty;
        }

        if (IsConstantFunctionName(name))
        {
            *shortNameLength = nameLength;
            return name;
        }
        uint shortNameOffset = this->GetShortDisplayNameOffset();
        const char16 * shortName = name + shortNameOffset;
        bool isBracketCase = shortNameOffset != 0 && name[shortNameOffset-1] == '[';
        Assert(nameLength >= shortNameOffset);
        *shortNameLength = nameLength - shortNameOffset;

        if (!isBracketCase)
        {
            return shortName;
        }

        Assert(name[nameLength - 1] == ']');
        char16 * finalshorterName = RecyclerNewArrayLeaf(this->GetScriptContext()->GetRecycler(), char16, *shortNameLength);
        js_wmemcpy_s(finalshorterName, *shortNameLength, shortName, *shortNameLength - 1); // we don't want the last character in shorterName
        finalshorterName[*shortNameLength - 1] = _u('\0');
        *shortNameLength = *shortNameLength - 1;
        return finalshorterName;
    }